

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MissingPropertyTypeHandler.cpp
# Opt level: O1

void Js::MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject *instance)

{
  RecyclableObject *pRVar1;
  
  pRVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  Memory::Recycler::WBSetBit((char *)(instance + 1));
  instance[1].super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)pRVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(instance + 1);
  return;
}

Assistant:

void MissingPropertyTypeHandler::SetUndefinedPropertySlot(DynamicObject* instance)
    {
        Field(Var)* slots = reinterpret_cast<Field(Var)*>(reinterpret_cast<size_t>(instance) + sizeof(DynamicObject));
        slots[0] = instance->GetLibrary()->GetUndefined();
    }